

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

_Bool lore_is_fully_known(monster_race *race)

{
  long lVar1;
  blow_method **ppbVar2;
  ulong uVar3;
  _Bool _Var4;
  monster_lore *lore;
  
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x6cb,"struct monster_lore *get_lore(const struct monster_race *)");
  }
  _Var4 = true;
  if (l_list[race->ridx].all_known == false) {
    lore = l_list + race->ridx;
    if (((lore->armour_known == true) &&
        (((lore->spell_freq_known != false || (race->freq_innate + race->freq_spell == 0)) &&
         (lore->drop_known == true)))) && (lore->sleep_known == true)) {
      if ((ulong)z_info->mon_blows_max != 0) {
        ppbVar2 = &race->blow->method;
        uVar3 = 0;
        do {
          if (*ppbVar2 == (blow_method *)0x0) break;
          if (lore->blow_known[uVar3] == false) goto LAB_0016d526;
          uVar3 = uVar3 + 1;
          ppbVar2 = ppbVar2 + 6;
        } while (z_info->mon_blows_max != uVar3);
      }
      lVar1 = 0;
      do {
        if (lore->flags[lVar1] == '\0') goto LAB_0016d526;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0xb);
      lVar1 = 0;
      do {
        if (lore->spell_flags[lVar1] != race->spell_flags[lVar1]) goto LAB_0016d526;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0xc);
      lore->all_known = true;
      lore_update(race,lore);
    }
    else {
LAB_0016d526:
      _Var4 = false;
    }
  }
  return _Var4;
}

Assistant:

bool lore_is_fully_known(const struct monster_race *race)
{
	unsigned i;
	struct monster_lore *lore = get_lore(race);

	/* Check if already known */
	if (lore->all_known)
		return true;
		
	if (!lore->armour_known)
		return false;
	/* Only check spells if the monster can cast them */
	if (!lore->spell_freq_known && race->freq_innate + race->freq_spell)
		return false;
	if (!lore->drop_known)
		return false;
	if (!lore->sleep_known)
		return false;
		
	/* Check if blows are known */
	for (i = 0; i < z_info->mon_blows_max; i++){
		/* Only check if the blow exists */
		if (!race->blow[i].method)
			break;
		if (!lore->blow_known[i])
			return false;
		
	}
		
	/* Check all the flags */
	for (i = 0; i < RF_SIZE; i++)
		if (!lore->flags[i])
			return false;
		
		
	/* Check spell flags */
	for (i = 0; i < RSF_SIZE; i++)
		if (lore->spell_flags[i] != race->spell_flags[i])			
			return false;
	
	/* The player knows everything */
	lore->all_known = true;
	lore_update(race, lore);
	return true;
}